

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dSFMT.c
# Opt level: O1

void dsfmt_fill_array_open_open(dsfmt_t *dsfmt,double *array,int size)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  double dVar3;
  double dVar4;
  ulong uVar5;
  undefined8 uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  uint64_t uVar12;
  uint64_t uVar13;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  double *pdVar17;
  long lVar18;
  
  if ((size & 1U) != 0) {
    __assert_fail("size % 2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Waterpine[P]IMAGE/SFMT/dSFMT/dSFMT.c"
                  ,0x231,"void dsfmt_fill_array_open_open(dsfmt_t *, double *, int)");
  }
  if (size < 0x17e) {
    __assert_fail("size >= DSFMT_N64",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Waterpine[P]IMAGE/SFMT/dSFMT/dSFMT.c"
                  ,0x232,"void dsfmt_fill_array_open_open(dsfmt_t *, double *, int)");
  }
  uVar8 = *(ulong *)((long)dsfmt->status + 0xbf8);
  uVar10 = (uVar8 << 0x20 | uVar8 >> 0x20) ^ dsfmt->status[0].u[0] << 0x13 ^
           dsfmt->status[0x75].u[0];
  uVar8 = dsfmt->status[0].u[1];
  uVar14 = (dsfmt->status[0xbf].u[0] << 0x20 | dsfmt->status[0xbf].u[0] >> 0x20) ^ uVar8 << 0x13 ^
           *(ulong *)((long)dsfmt->status + 0x758);
  *array = (double)(uVar10 & 0xffafffffffb3f ^ uVar10 >> 0xc ^ dsfmt->status[0].u[0]);
  array[1] = (double)(uVar14 & 0xffdfffc90fffd ^ uVar14 >> 0xc ^ uVar8);
  lVar15 = 0;
  do {
    uVar8 = *(ulong *)((long)dsfmt->status + lVar15 + 0x10);
    uVar7 = *(ulong *)((long)dsfmt->status + lVar15 + 0x18);
    uVar11 = (uVar14 << 0x20 | uVar14 >> 0x20) ^ uVar8 << 0x13 ^
             *(ulong *)((long)dsfmt->status + lVar15 + 0x760);
    uVar14 = (uVar10 << 0x20 | uVar10 >> 0x20) ^ uVar7 << 0x13 ^
             *(ulong *)((long)dsfmt->status + lVar15 + 0x768);
    *(ulong *)((long)array + lVar15 + 0x10) = uVar11 & 0xffafffffffb3f ^ uVar11 >> 0xc ^ uVar8;
    *(ulong *)((long)array + lVar15 + 0x18) = uVar14 & 0xffdfffc90fffd ^ uVar14 >> 0xc ^ uVar7;
    lVar15 = lVar15 + 0x10;
    uVar10 = uVar11;
  } while (lVar15 != 0x490);
  lVar15 = 0;
  do {
    uVar8 = *(ulong *)((long)dsfmt->status + lVar15 + 0x4a0);
    uVar10 = *(ulong *)((long)dsfmt->status + lVar15 + 0x4a8);
    uVar12 = (uVar14 << 0x20 | uVar14 >> 0x20) ^ uVar8 << 0x13 ^ *(ulong *)((long)array + lVar15);
    uVar14 = (uVar11 << 0x20 | uVar11 >> 0x20) ^ uVar10 << 0x13 ^
             *(ulong *)((long)array + lVar15 + 8);
    *(uint64_t *)((long)array + lVar15 + 0x4a0) = uVar12 & 0xffafffffffb3f ^ uVar12 >> 0xc ^ uVar8;
    *(ulong *)((long)array + lVar15 + 0x4a8) = uVar14 & 0xffdfffc90fffd ^ uVar14 >> 0xc ^ uVar10;
    lVar15 = lVar15 + 0x10;
    uVar11 = uVar12;
  } while (lVar15 != 0x750);
  uVar16 = (uint)size >> 1;
  uVar8 = 0xbf;
  if (0x2fc < (uint)size) {
    uVar8 = 0xbf;
    uVar10 = uVar12;
    pdVar17 = array;
    do {
      dVar3 = *pdVar17;
      dVar4 = pdVar17[1];
      uVar12 = (uVar14 << 0x20 | uVar14 >> 0x20) ^ (long)dVar3 << 0x13 ^ (ulong)pdVar17[0xea];
      uVar14 = (uVar10 << 0x20 | uVar10 >> 0x20) ^ (long)dVar4 << 0x13 ^ (ulong)pdVar17[0xeb];
      pdVar17[0x17e] = (double)(uVar12 & 0xffafffffffb3f ^ uVar12 >> 0xc ^ (ulong)dVar3);
      pdVar17[0x17f] = (double)(uVar14 & 0xffdfffc90fffd ^ uVar14 >> 0xc ^ (ulong)dVar4);
      *pdVar17 = (double)((ulong)dVar3 | 1) + -1.0;
      pdVar17[1] = (double)((ulong)dVar4 | 1) + -1.0;
      uVar8 = uVar8 + 1;
      pdVar17 = pdVar17 + 2;
      uVar10 = uVar12;
    } while (uVar16 - 0xbf != uVar8);
  }
  uVar10 = (ulong)uVar16;
  if ((uint)size < 0x2fc) {
    uVar11 = 1;
    if (1 < (int)(0x17e - uVar16)) {
      uVar11 = (ulong)(0x17e - uVar16);
    }
    lVar15 = -0xbf0;
    uVar7 = 0;
    do {
      puVar1 = (undefined8 *)((long)array + lVar15 + uVar10 * 0x10);
      uVar6 = puVar1[1];
      puVar2 = (undefined8 *)((long)dsfmt->status + lVar15 + 0xbf0);
      *puVar2 = *puVar1;
      puVar2[1] = uVar6;
      uVar7 = uVar7 + 1;
      lVar15 = lVar15 + 0x10;
    } while (uVar11 != uVar7);
  }
  else {
    uVar7 = 0;
  }
  if ((int)uVar8 < (int)uVar16) {
    uVar8 = uVar8 & 0xffffffff;
    lVar9 = uVar10 - uVar8;
    lVar15 = uVar8 * 0x10 + -0xbf0;
    lVar18 = 8;
    uVar13 = uVar12;
    do {
      uVar11 = *(ulong *)((long)array + lVar18 + uVar8 * 0x10 + -0xbf8);
      uVar5 = *(ulong *)((long)array + lVar18 + lVar15);
      uVar12 = (uVar14 << 0x20 | uVar14 >> 0x20) ^ uVar11 << 0x13 ^
               *(ulong *)((long)array + lVar18 + uVar8 * 0x10 + -0x4a8);
      uVar14 = (uVar13 << 0x20 | uVar13 >> 0x20) ^ uVar5 << 0x13 ^
               *(ulong *)((long)array + lVar18 + uVar8 * 0x10 + -0x4a0);
      *(uint64_t *)((long)array + lVar18 + uVar8 * 0x10 + -8) =
           uVar12 & 0xffafffffffb3f ^ uVar12 >> 0xc ^ uVar11;
      *(ulong *)((long)array + lVar18 + uVar8 * 0x10) =
           uVar14 & 0xffdfffc90fffd ^ uVar14 >> 0xc ^ uVar5;
      puVar2 = (undefined8 *)((long)array + lVar18 + uVar8 * 0x10 + -8);
      uVar6 = puVar2[1];
      puVar1 = (undefined8 *)((long)dsfmt->status + lVar18 + uVar7 * 0x10 + -8);
      *puVar1 = *puVar2;
      puVar1[1] = uVar6;
      uVar11 = *(ulong *)((long)array + lVar18 + lVar15);
      *(double *)((long)array + lVar18 + uVar8 * 0x10 + -0xbf8) =
           (double)(*(ulong *)((long)array + lVar18 + uVar8 * 0x10 + -0xbf8) | 1) + -1.0;
      *(double *)((long)array + lVar18 + lVar15) = (double)(uVar11 | 1) + -1.0;
      lVar18 = lVar18 + 0x10;
      lVar9 = lVar9 + -1;
      uVar13 = uVar12;
    } while (lVar9 != 0);
  }
  lVar15 = -0xbf0;
  do {
    uVar8 = *(ulong *)((long)array + lVar15 + uVar10 * 0x10 + 8);
    *(double *)((long)array + lVar15 + uVar10 * 0x10) =
         (double)(*(ulong *)((long)array + lVar15 + uVar10 * 0x10) | 1) + -1.0;
    *(double *)((long)array + lVar15 + uVar10 * 0x10 + 8) = (double)(uVar8 | 1) + -1.0;
    lVar15 = lVar15 + 0x10;
  } while (lVar15 != 0);
  dsfmt->status[0xbf].u[0] = uVar12;
  *(ulong *)((long)dsfmt->status + 0xbf8) = uVar14;
  return;
}

Assistant:

void dsfmt_fill_array_open_open(dsfmt_t* dsfmt, double array[], int size)
{
	assert(size % 2 == 0);
	assert(size >= DSFMT_N64);
	gen_rand_array_o0o1(dsfmt, (w128_t *)array, size / 2);
}